

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O0

vector<CardStyle,_std::allocator<CardStyle>_> * __thiscall
BattleWithLandlord::GenStrategy
          (BattleWithLandlord *this,multiset<char,_std::less<char>,_std::allocator<char>_> *style,
          CardStyle *last)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  pointer ppVar4;
  mapped_type *pmVar5;
  reference pcVar6;
  _Self *__x;
  CardStyle *in_RCX;
  vector<CardStyle,_std::allocator<CardStyle>_> *in_RDI;
  char x_3;
  iterator __end10_2;
  iterator __begin10_2;
  multiset<char,_std::less<char>,_std::allocator<char>_> *__range10_2;
  multiset<char,_std::less<char>,_std::allocator<char>_> _union_3;
  multiset<char,_std::less<char>,_std::allocator<char>_> *cs_3;
  iterator __end9_1;
  iterator __begin9_1;
  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
  *__range9_1;
  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
  comb_res_3;
  iterator it_7;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> count__3;
  int prev_6;
  int len_6;
  iterator it_6;
  int prev_5;
  int len_5;
  iterator it_5;
  int prev_4;
  int len_4;
  iterator it_4;
  int prev_3;
  int len_3;
  char x_2;
  iterator __end7_2;
  iterator __begin7_2;
  multiset<char,_std::less<char>,_std::allocator<char>_> *__range7_2;
  multiset<char,_std::less<char>,_std::allocator<char>_> _union_2;
  multiset<char,_std::less<char>,_std::allocator<char>_> *cs_2;
  iterator __end6;
  iterator __begin6;
  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
  *__range6;
  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
  comb_res_2;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> count__2;
  CardStyle style_1;
  multiset<char,_std::less<char>,_std::allocator<char>_> ms_2;
  iterator c_2;
  char x_1;
  iterator __end10_1;
  iterator __begin10_1;
  multiset<char,_std::less<char>,_std::allocator<char>_> *__range10_1;
  multiset<char,_std::less<char>,_std::allocator<char>_> _union_1;
  multiset<char,_std::less<char>,_std::allocator<char>_> *cs_1;
  iterator __end9;
  iterator __begin9;
  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
  *__range9;
  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
  comb_res_1;
  int carry_1;
  const_iterator __end7_1;
  const_iterator __begin7_1;
  initializer_list<int> *__range7_1;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> count__1;
  char x;
  iterator __end11;
  iterator __begin11;
  multiset<char,_std::less<char>,_std::allocator<char>_> *__range11;
  multiset<char,_std::less<char>,_std::allocator<char>_> _union;
  multiset<char,_std::less<char>,_std::allocator<char>_> *cs;
  iterator __end10;
  iterator __begin10;
  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
  *__range10;
  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
  comb_res;
  iterator it_3;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> count_;
  int carry;
  const_iterator __end7;
  const_iterator __begin7;
  initializer_list<int> *__range7;
  iterator it_2;
  int prev_2;
  int len_2;
  iterator it_1;
  int prev_1;
  int len_1;
  iterator it;
  int prev;
  int len;
  int i;
  multiset<char,_std::less<char>,_std::allocator<char>_> ms_1;
  int k;
  iterator c_1;
  multiset<char,_std::less<char>,_std::allocator<char>_> ms;
  iterator joker;
  iterator vice_joker;
  iterator c;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> count;
  vector<CardStyle,_std::allocator<CardStyle>_> *all;
  _Rb_tree_iterator<std::pair<const_char,_int>_> in_stack_fffffffffffff548;
  iterator in_stack_fffffffffffff550;
  iterator in_stack_fffffffffffff558;
  iterator in_stack_fffffffffffff560;
  multiset<char,_std::less<char>,_std::allocator<char>_> *in_stack_fffffffffffff568;
  undefined7 in_stack_fffffffffffff570;
  undefined1 in_stack_fffffffffffff577;
  iterator in_stack_fffffffffffff578;
  undefined7 in_stack_fffffffffffff580;
  undefined1 in_stack_fffffffffffff587;
  mapped_type *in_stack_fffffffffffff588;
  iterator in_stack_fffffffffffff590;
  iterator in_stack_fffffffffffff718;
  iterator in_stack_fffffffffffff720;
  _Rb_tree_iterator<std::pair<const_char,_int>_> in_stack_fffffffffffff728;
  bool local_891;
  _Self local_840;
  undefined4 local_834;
  _Base_ptr local_830;
  char local_821;
  _Self local_820;
  _Self local_818;
  reference local_810;
  reference local_7d8;
  multiset<char,_std::less<char>,_std::allocator<char>_> *local_7d0;
  __normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
  local_7c8;
  undefined1 *local_7c0;
  undefined1 local_7b8 [24];
  _Self local_7a0;
  _Self local_798 [7];
  int local_760;
  int local_75c;
  _Base_ptr local_758;
  _Base_ptr local_750;
  _Base_ptr local_748;
  undefined4 local_73c;
  _Base_ptr local_738;
  _Base_ptr local_730;
  _Base_ptr local_728;
  _Self local_720;
  _Base_ptr local_718;
  _Self local_710;
  _Base_ptr local_708;
  int local_6fc;
  int local_6f8;
  undefined4 local_6f4;
  _Base_ptr local_6f0;
  _Base_ptr local_6e8;
  _Base_ptr local_6e0;
  undefined4 local_6d4;
  _Base_ptr local_6d0;
  _Base_ptr local_6c8;
  _Self local_6c0;
  _Base_ptr local_6b8;
  _Self local_6b0;
  _Base_ptr local_6a8;
  int local_69c;
  int local_698;
  undefined4 local_694;
  _Base_ptr local_690;
  _Base_ptr local_688;
  undefined4 local_67c;
  _Base_ptr local_678;
  _Self local_670;
  _Base_ptr local_668;
  _Self local_660;
  _Base_ptr local_658;
  int local_64c;
  int local_648;
  undefined4 local_644;
  _Base_ptr local_640;
  undefined4 local_638;
  undefined4 local_634;
  _Base_ptr local_630;
  char local_621;
  _Self local_620;
  _Self local_618;
  reference local_610;
  reference local_5d8;
  multiset<char,_std::less<char>,_std::allocator<char>_> *local_5d0;
  __normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
  local_5c8;
  undefined1 *local_5c0;
  undefined1 local_5b8 [120];
  CardStyle local_540;
  _Base_ptr local_500;
  _Base_ptr local_4f8;
  _Base_ptr local_4f0;
  _Base_ptr local_4e8;
  _Self local_4b0;
  _Self local_4a8 [2];
  CardStyle *local_498;
  CardStyle *local_490;
  undefined4 local_488;
  undefined4 local_484;
  _Base_ptr local_480;
  char local_471;
  _Self local_470;
  _Self local_468;
  reference local_460;
  reference local_428;
  multiset<char,_std::less<char>,_std::allocator<char>_> *local_420;
  __normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
  local_418;
  undefined1 *local_410;
  undefined1 local_408 [28];
  int local_3ec;
  const_iterator local_3e8;
  const_iterator local_3e0;
  int local_3d8 [2];
  initializer_list<int> local_3d0;
  initializer_list<int> *local_3c0;
  undefined4 local_384;
  _Base_ptr local_380;
  _Base_ptr local_378;
  _Base_ptr local_370;
  int local_364;
  _Self local_360;
  undefined4 local_354;
  _Base_ptr local_350;
  char local_341;
  _Self local_340;
  _Self local_338;
  reference local_330;
  reference local_2f8;
  multiset<char,_std::less<char>,_std::allocator<char>_> *local_2f0;
  __normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
  local_2e8;
  undefined1 *local_2e0;
  undefined1 local_2d8 [24];
  _Self local_2c0;
  _Self local_2b8 [7];
  _Base_ptr local_280;
  _Base_ptr local_278;
  _Base_ptr local_270;
  int local_264;
  const_iterator local_260;
  const_iterator local_258;
  int local_250 [2];
  initializer_list<int> local_248;
  initializer_list<int> *local_238;
  undefined4 local_22c;
  _Base_ptr local_228;
  _Base_ptr local_220;
  _Base_ptr local_218;
  _Self local_210;
  _Base_ptr local_208;
  _Self local_200;
  _Base_ptr local_1f8;
  int local_1f0;
  int local_1ec;
  undefined4 local_1e8;
  undefined4 local_1e4;
  _Base_ptr local_1e0;
  _Base_ptr local_1d8;
  _Self local_1d0;
  _Base_ptr local_1c8;
  _Self local_1c0;
  _Base_ptr local_1b8;
  int local_1b0;
  int local_1ac;
  undefined4 local_1a8;
  undefined4 local_1a4;
  _Base_ptr local_1a0;
  _Self local_198;
  _Base_ptr local_190;
  _Self local_188;
  _Base_ptr local_180;
  int local_178;
  int local_174;
  undefined4 local_170;
  undefined4 local_16c;
  _Base_ptr local_168;
  int local_15c;
  int local_124;
  _Self local_120;
  _Self local_118;
  undefined4 local_110;
  undefined4 local_10c;
  _Base_ptr local_108;
  undefined1 local_f9;
  _Base_ptr local_f8;
  undefined1 local_e9;
  _Self local_b8;
  _Self local_b0;
  undefined1 local_a1;
  _Self local_a0;
  undefined1 local_91;
  _Self local_90;
  _Self local_88 [3];
  _Self local_70;
  _Self local_68;
  _Self local_60 [7];
  byte local_21;
  CardStyle *local_20;
  
  local_21 = 0;
  local_20 = in_RCX;
  std::vector<CardStyle,_std::allocator<CardStyle>_>::vector
            ((vector<CardStyle,_std::allocator<CardStyle>_> *)0x11fa67);
  std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::map
            ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *)
             0x11fa74);
  local_60[0]._M_node =
       (_Base_ptr)
       std::multiset<char,_std::less<char>,_std::allocator<char>_>::begin
                 (in_stack_fffffffffffff548._M_node);
  while( true ) {
    local_68._M_node =
         (_Base_ptr)
         std::multiset<char,_std::less<char>,_std::allocator<char>_>::end
                   (in_stack_fffffffffffff548._M_node);
    bVar2 = std::operator!=(local_60,&local_68);
    if (!bVar2) break;
    std::_Rb_tree_const_iterator<char>::operator*
              ((_Rb_tree_const_iterator<char> *)in_stack_fffffffffffff550._M_node);
    local_70._M_node =
         (_Base_ptr)
         std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::find
                   (in_stack_fffffffffffff548._M_node,(key_type *)0x11fad9);
    local_88[0]._M_node =
         (_Base_ptr)
         std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::end
                   (in_stack_fffffffffffff548._M_node);
    bVar2 = std::operator!=(&local_70,local_88);
    if (bVar2) {
      std::_Rb_tree_const_iterator<char>::operator*
                ((_Rb_tree_const_iterator<char> *)in_stack_fffffffffffff550._M_node);
      pmVar5 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
               operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                           *)in_stack_fffffffffffff590._M_node,(key_type *)in_stack_fffffffffffff588
                         );
      *pmVar5 = *pmVar5 + 1;
    }
    else {
      std::_Rb_tree_const_iterator<char>::operator*
                ((_Rb_tree_const_iterator<char> *)in_stack_fffffffffffff550._M_node);
      pmVar5 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
               operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                           *)in_stack_fffffffffffff590._M_node,(key_type *)in_stack_fffffffffffff588
                         );
      *pmVar5 = 1;
    }
    std::_Rb_tree_const_iterator<char>::operator++
              ((_Rb_tree_const_iterator<char> *)in_stack_fffffffffffff550._M_node);
  }
  local_91 = 0x11;
  local_90._M_node =
       (_Base_ptr)
       std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::find
                 (in_stack_fffffffffffff548._M_node,(key_type *)0x11fbda);
  local_a1 = 0x12;
  local_a0._M_node =
       (_Base_ptr)
       std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::find
                 (in_stack_fffffffffffff548._M_node,(key_type *)0x11fc11);
  local_b0._M_node =
       (_Base_ptr)
       std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::end
                 (in_stack_fffffffffffff548._M_node);
  bVar2 = std::operator!=(&local_90,&local_b0);
  local_891 = false;
  if (bVar2) {
    local_b8._M_node =
         (_Base_ptr)
         std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::end
                   (in_stack_fffffffffffff548._M_node);
    local_891 = std::operator!=(&local_a0,&local_b8);
  }
  if (local_891 != false) {
    std::multiset<char,_std::less<char>,_std::allocator<char>_>::multiset
              ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x11fcbd);
    local_e9 = 0x11;
    local_f8 = (_Base_ptr)
               std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                         (in_stack_fffffffffffff558._M_node,in_stack_fffffffffffff550._M_node);
    local_f9 = 0x12;
    local_108 = (_Base_ptr)
                std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                          (in_stack_fffffffffffff558._M_node,in_stack_fffffffffffff550._M_node);
    local_10c = 6;
    local_110 = 0x13;
    std::vector<CardStyle,std::allocator<CardStyle>>::
    emplace_back<CardStyle::Type,int,std::multiset<char,std::less<char>,std::allocator<char>>&>
              ((vector<CardStyle,_std::allocator<CardStyle>_> *)
               CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
               (Type *)in_stack_fffffffffffff568,(int *)in_stack_fffffffffffff560._M_node,
               (multiset<char,_std::less<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff558._M_node);
    std::multiset<char,_std::less<char>,_std::allocator<char>_>::~multiset
              ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x11fd75);
  }
  if (local_20->type == PASS) {
    local_118._M_node =
         (_Base_ptr)
         std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::begin
                   (in_stack_fffffffffffff548._M_node);
    while( true ) {
      local_120._M_node =
           (_Base_ptr)
           std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::end
                     (in_stack_fffffffffffff548._M_node);
      bVar2 = std::operator!=(&local_118,&local_120);
      if (!bVar2) break;
      for (local_124 = 1; iVar1 = local_124,
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x11fe1c),
          iVar1 <= ppVar4->second && local_124 < 5; local_124 = local_124 + 1) {
        std::multiset<char,_std::less<char>,_std::allocator<char>_>::multiset
                  ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x11fe63);
        for (local_15c = 0; local_15c < local_124; local_15c = local_15c + 1) {
          std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                    ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x11fe8b);
          local_168 = (_Base_ptr)
                      std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                (in_stack_fffffffffffff558._M_node,in_stack_fffffffffffff550._M_node
                                );
        }
        if (local_124 == 1) {
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x11fefc);
          if (ppVar4->first < '\x01') {
            local_170 = 7;
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x11ff58);
            std::vector<CardStyle,std::allocator<CardStyle>>::
            emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                      ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                       CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                       (Type *)in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560._M_node,
                       (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff558._M_node);
          }
          else {
            local_16c = 1;
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x11ff1c);
            std::vector<CardStyle,std::allocator<CardStyle>>::
            emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                      ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                       CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                       (Type *)in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560._M_node,
                       (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff558._M_node);
          }
          local_174 = 1;
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x11ff94);
          local_178 = (int)ppVar4->first;
          local_180 = local_118._M_node;
          while( true ) {
            local_190 = local_180;
            local_188._M_node =
                 (_Base_ptr)
                 std::next<std::_Rb_tree_iterator<std::pair<char_const,int>>>
                           (in_stack_fffffffffffff548,0x11ffd0);
            local_198._M_node =
                 (_Base_ptr)
                 std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                 ::end(in_stack_fffffffffffff548._M_node);
            bVar2 = std::operator!=(&local_188,&local_198);
            if (!bVar2) break;
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator++
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)
                       in_stack_fffffffffffff550._M_node);
            ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                               ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x120032);
            local_178 = local_178 + 1;
            if (ppVar4->first != local_178) break;
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x12005c);
            local_1a0 = (_Base_ptr)
                        std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                  (in_stack_fffffffffffff558._M_node,
                                   in_stack_fffffffffffff550._M_node);
            local_174 = local_174 + 1;
            if (4 < local_174) {
              local_1a4 = 1;
              std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1200b4);
              std::vector<CardStyle,std::allocator<CardStyle>>::
              emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                        ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                         CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                         (Type *)in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560._M_node
                         ,(multiset<char,_std::less<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff558._M_node,(int *)in_stack_fffffffffffff550._M_node
                        );
            }
          }
        }
        else if (local_124 == 2) {
          local_1a8 = 2;
          std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                    ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x120110);
          std::vector<CardStyle,std::allocator<CardStyle>>::
          emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                    ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                     CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                     (Type *)in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560._M_node,
                     (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff558._M_node);
          local_1ac = 1;
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x12014a);
          local_1b0 = (int)ppVar4->first;
          local_1b8 = local_118._M_node;
          while( true ) {
            local_1c8 = local_1b8;
            in_stack_fffffffffffff728 =
                 std::next<std::_Rb_tree_iterator<std::pair<char_const,int>>>
                           (in_stack_fffffffffffff548,0x120186);
            local_1c0._M_node = in_stack_fffffffffffff728._M_node;
            local_1d0._M_node =
                 (_Base_ptr)
                 std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                 ::end(in_stack_fffffffffffff548._M_node);
            bVar2 = std::operator!=(&local_1c0,&local_1d0);
            if (!bVar2) break;
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator++
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)
                       in_stack_fffffffffffff550._M_node);
            ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                               ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1201e8);
            local_1b0 = local_1b0 + 1;
            if ((ppVar4->first != local_1b0) ||
               (ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                                   ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x12020d),
               ppVar4->second < 2)) break;
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x120225);
            in_stack_fffffffffffff720 =
                 std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                           (in_stack_fffffffffffff558._M_node,in_stack_fffffffffffff550._M_node);
            local_1d8 = in_stack_fffffffffffff720._M_node;
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x12025c);
            in_stack_fffffffffffff718 =
                 std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                           (in_stack_fffffffffffff558._M_node,in_stack_fffffffffffff550._M_node);
            local_1ac = local_1ac + 1;
            local_1e0 = in_stack_fffffffffffff718._M_node;
            if (2 < local_1ac) {
              local_1e4 = 2;
              std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1202b4);
              std::vector<CardStyle,std::allocator<CardStyle>>::
              emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                        ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                         CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                         (Type *)in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560._M_node
                         ,(multiset<char,_std::less<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff558._M_node,(int *)in_stack_fffffffffffff550._M_node
                        );
            }
          }
        }
        else if (local_124 == 3) {
          local_1e8 = 3;
          std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                    ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x120310);
          std::vector<CardStyle,std::allocator<CardStyle>>::
          emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                    ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                     CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                     (Type *)in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560._M_node,
                     (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff558._M_node);
          local_1ec = 1;
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x12034a);
          local_1f0 = (int)ppVar4->first;
          local_1f8 = local_118._M_node;
          while( true ) {
            local_208 = local_1f8;
            local_200._M_node =
                 (_Base_ptr)
                 std::next<std::_Rb_tree_iterator<std::pair<char_const,int>>>
                           (in_stack_fffffffffffff548,0x120386);
            local_210._M_node =
                 (_Base_ptr)
                 std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                 ::end(in_stack_fffffffffffff548._M_node);
            bVar2 = std::operator!=(&local_200,&local_210);
            if (!bVar2) break;
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator++
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)
                       in_stack_fffffffffffff550._M_node);
            ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                               ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1203e8);
            local_1f0 = local_1f0 + 1;
            if ((ppVar4->first != local_1f0) ||
               (ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                                   ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x12040d),
               ppVar4->second < 3)) break;
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x120425);
            local_218 = (_Base_ptr)
                        std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                  (in_stack_fffffffffffff558._M_node,
                                   in_stack_fffffffffffff550._M_node);
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x12045c);
            local_220 = (_Base_ptr)
                        std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                  (in_stack_fffffffffffff558._M_node,
                                   in_stack_fffffffffffff550._M_node);
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x120493);
            local_228 = (_Base_ptr)
                        std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                  (in_stack_fffffffffffff558._M_node,
                                   in_stack_fffffffffffff550._M_node);
            local_1ec = local_1ec + 1;
            local_22c = 3;
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1204e5);
            std::vector<CardStyle,std::allocator<CardStyle>>::
            emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                      ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                       CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                       (Type *)in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560._M_node,
                       (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff558._M_node,(int *)in_stack_fffffffffffff550._M_node);
          }
          local_250[0] = 1;
          local_250[1] = 2;
          local_248._M_array = local_250;
          local_248._M_len = 2;
          local_238 = &local_248;
          local_258 = std::initializer_list<int>::begin(local_238);
          local_260 = std::initializer_list<int>::end
                                ((initializer_list<int> *)in_stack_fffffffffffff550._M_node);
          for (; local_258 != local_260; local_258 = local_258 + 1) {
            local_264 = *local_258;
            std::multiset<char,_std::less<char>,_std::allocator<char>_>::clear
                      ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x1205bc);
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1205c9);
            local_270 = (_Base_ptr)
                        std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                  (in_stack_fffffffffffff558._M_node,
                                   in_stack_fffffffffffff550._M_node);
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x120600);
            local_278 = (_Base_ptr)
                        std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                  (in_stack_fffffffffffff558._M_node,
                                   in_stack_fffffffffffff550._M_node);
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x120637);
            local_280 = (_Base_ptr)
                        std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                  (in_stack_fffffffffffff558._M_node,
                                   in_stack_fffffffffffff550._M_node);
            local_1ec = 1;
            ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                               ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x120679);
            local_1f0 = (int)ppVar4->first;
            std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::map
                      ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                        *)in_stack_fffffffffffff550._M_node,
                       (map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                        *)in_stack_fffffffffffff548._M_node);
            local_2b8[0]._M_node = local_118._M_node;
            do {
              local_2c0._M_node =
                   (_Base_ptr)
                   std::
                   map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                   end(in_stack_fffffffffffff548._M_node);
              bVar2 = std::operator!=(local_2b8,&local_2c0);
              if (!bVar2) break;
              std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1206ea);
              pmVar5 = std::
                       map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                       ::operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                     *)in_stack_fffffffffffff590._M_node,
                                    (key_type *)in_stack_fffffffffffff588);
              *pmVar5 = 0;
              std::
              vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                        *)0x120727);
              bVar2 = GenCarry((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                *)in_stack_fffffffffffff728._M_node,
                               (uint)((ulong)in_stack_fffffffffffff720._M_node >> 0x20),
                               (int)in_stack_fffffffffffff720._M_node,
                               (vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                *)in_stack_fffffffffffff718._M_node);
              if (bVar2) {
                local_2e0 = local_2d8;
                local_2e8._M_current =
                     (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffff548._M_node);
                local_2f0 = (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                            std::
                            vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                            ::end((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_fffffffffffff548._M_node);
                while (bVar2 = __gnu_cxx::operator!=
                                         ((__normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                                           *)in_stack_fffffffffffff550._M_node,
                                          (__normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                                           *)in_stack_fffffffffffff548._M_node), bVar2) {
                  local_2f8 = __gnu_cxx::
                              __normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                              ::operator*(&local_2e8);
                  std::multiset<char,_std::less<char>,_std::allocator<char>_>::multiset
                            ((multiset<char,_std::less<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff550._M_node,
                             (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff548._M_node);
                  local_330 = local_2f8;
                  local_338._M_node =
                       (_Base_ptr)
                       std::multiset<char,_std::less<char>,_std::allocator<char>_>::begin
                                 (in_stack_fffffffffffff548._M_node);
                  local_340._M_node =
                       (_Base_ptr)
                       std::multiset<char,_std::less<char>,_std::allocator<char>_>::end
                                 (in_stack_fffffffffffff548._M_node);
                  while (bVar2 = std::operator!=(&local_338,&local_340), bVar2) {
                    pcVar6 = std::_Rb_tree_const_iterator<char>::operator*
                                       ((_Rb_tree_const_iterator<char> *)
                                        in_stack_fffffffffffff550._M_node);
                    local_341 = *pcVar6;
                    local_350 = (_Base_ptr)
                                std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                          (in_stack_fffffffffffff558._M_node,
                                           in_stack_fffffffffffff550._M_node);
                    std::_Rb_tree_const_iterator<char>::operator++
                              ((_Rb_tree_const_iterator<char> *)in_stack_fffffffffffff550._M_node);
                  }
                  local_354 = 3;
                  std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                            ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x120903);
                  std::vector<CardStyle,std::allocator<CardStyle>>::
                  emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&,int&>
                            ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                             CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580),
                             &(in_stack_fffffffffffff578._M_node)->_M_color,
                             (char *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                             in_stack_fffffffffffff568,(int *)in_stack_fffffffffffff560._M_node,
                             (int *)in_stack_fffffffffffff558._M_node);
                  std::multiset<char,_std::less<char>,_std::allocator<char>_>::~multiset
                            ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x120942);
                  __gnu_cxx::
                  __normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_2e8);
                }
              }
              __x = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator++
                              ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)
                               in_stack_fffffffffffff550._M_node);
              local_360._M_node =
                   (_Base_ptr)
                   std::
                   map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                   end(in_stack_fffffffffffff548._M_node);
              bVar3 = std::operator==(__x,&local_360);
              bVar2 = true;
              if (!bVar3) {
                ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                                   ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1209b2);
                local_1f0 = local_1f0 + 1;
                bVar2 = true;
                if (ppVar4->first == local_1f0) {
                  ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                                     ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1209e0);
                  bVar2 = ppVar4->second < 3;
                }
              }
              if (bVar2) {
                local_364 = 0x16;
              }
              else {
                std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                          ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x120a18);
                local_370 = (_Base_ptr)
                            std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                      (in_stack_fffffffffffff558._M_node,
                                       in_stack_fffffffffffff550._M_node);
                std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                          ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x120a4f);
                local_378 = (_Base_ptr)
                            std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                      (in_stack_fffffffffffff558._M_node,
                                       in_stack_fffffffffffff550._M_node);
                std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                          ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x120a86);
                local_380 = (_Base_ptr)
                            std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                      (in_stack_fffffffffffff558._M_node,
                                       in_stack_fffffffffffff550._M_node);
                local_1ec = local_1ec + 1;
                local_364 = 0;
              }
              std::
              vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff560._M_node);
            } while (local_364 == 0);
            std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::~map
                      ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                        *)0x120b09);
          }
        }
        else {
          local_384 = 5;
          std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                    ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x120b51);
          std::vector<CardStyle,std::allocator<CardStyle>>::
          emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                    ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                     CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                     (Type *)in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560._M_node,
                     (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff558._M_node);
          std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::map
                    ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                      *)in_stack_fffffffffffff550._M_node,
                     (map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                      *)in_stack_fffffffffffff548._M_node);
          std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                    ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x120b97);
          pmVar5 = std::
                   map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                   operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                               *)in_stack_fffffffffffff590._M_node,
                              (key_type *)in_stack_fffffffffffff588);
          *pmVar5 = *pmVar5 + -4;
          local_3d8[0] = 1;
          local_3d8[1] = 2;
          local_3d0._M_array = local_3d8;
          local_3d0._M_len = 2;
          local_3c0 = &local_3d0;
          local_3e0 = std::initializer_list<int>::begin(local_3c0);
          local_3e8 = std::initializer_list<int>::end
                                ((initializer_list<int> *)in_stack_fffffffffffff550._M_node);
          for (; local_3e0 != local_3e8; local_3e0 = local_3e0 + 1) {
            local_3ec = *local_3e0;
            std::
            vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                      *)0x120c68);
            bVar2 = GenCarry((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                              *)in_stack_fffffffffffff728._M_node,
                             (uint)((ulong)in_stack_fffffffffffff720._M_node >> 0x20),
                             (int)in_stack_fffffffffffff720._M_node,
                             (vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffff718._M_node);
            if (bVar2) {
              local_410 = local_408;
              local_418._M_current =
                   (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffff548._M_node);
              local_420 = (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                          std::
                          vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffff548._M_node);
              while (bVar2 = __gnu_cxx::operator!=
                                       ((__normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                                         *)in_stack_fffffffffffff550._M_node,
                                        (__normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                                         *)in_stack_fffffffffffff548._M_node), bVar2) {
                local_428 = __gnu_cxx::
                            __normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                            ::operator*(&local_418);
                std::multiset<char,_std::less<char>,_std::allocator<char>_>::multiset
                          ((multiset<char,_std::less<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff550._M_node,
                           (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff548._M_node);
                local_460 = local_428;
                local_468._M_node =
                     (_Base_ptr)
                     std::multiset<char,_std::less<char>,_std::allocator<char>_>::begin
                               (in_stack_fffffffffffff548._M_node);
                local_470._M_node =
                     (_Base_ptr)
                     std::multiset<char,_std::less<char>,_std::allocator<char>_>::end
                               (in_stack_fffffffffffff548._M_node);
                while (bVar2 = std::operator!=(&local_468,&local_470), bVar2) {
                  pcVar6 = std::_Rb_tree_const_iterator<char>::operator*
                                     ((_Rb_tree_const_iterator<char> *)
                                      in_stack_fffffffffffff550._M_node);
                  local_471 = *pcVar6;
                  local_480 = (_Base_ptr)
                              std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                        (in_stack_fffffffffffff558._M_node,
                                         in_stack_fffffffffffff550._M_node);
                  std::_Rb_tree_const_iterator<char>::operator++
                            ((_Rb_tree_const_iterator<char> *)in_stack_fffffffffffff550._M_node);
                }
                local_484 = 4;
                std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                          ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x120e42);
                local_488 = 2;
                std::vector<CardStyle,std::allocator<CardStyle>>::
                emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int,int&>
                          ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                           CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580),
                           &(in_stack_fffffffffffff578._M_node)->_M_color,
                           (char *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                           in_stack_fffffffffffff568,(int *)in_stack_fffffffffffff560._M_node,
                           (int *)in_stack_fffffffffffff558._M_node);
                std::multiset<char,_std::less<char>,_std::allocator<char>_>::~multiset
                          ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x120e8c);
                __gnu_cxx::
                __normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_418);
              }
            }
            std::
            vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff560._M_node);
          }
          std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::~map
                    ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                      *)0x120ee2);
        }
        std::multiset<char,_std::less<char>,_std::allocator<char>_>::~multiset
                  ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x120f04);
      }
      std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)in_stack_fffffffffffff550._M_node
                );
    }
    local_490 = (CardStyle *)
                std::vector<CardStyle,_std::allocator<CardStyle>_>::begin
                          ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                           in_stack_fffffffffffff548._M_node);
    local_498 = (CardStyle *)
                std::vector<CardStyle,_std::allocator<CardStyle>_>::end
                          ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                           in_stack_fffffffffffff548._M_node);
    std::
    sort<__gnu_cxx::__normal_iterator<CardStyle*,std::vector<CardStyle,std::allocator<CardStyle>>>,BattleWithLandlord::GenStrategy(std::multiset<char,std::less<char>,std::allocator<char>>const&,CardStyle_const&)const::__0>
              (local_490,local_498);
  }
  else {
    local_4a8[0]._M_node =
         (_Base_ptr)
         std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::begin
                   (in_stack_fffffffffffff548._M_node);
    while( true ) {
      local_4b0._M_node =
           (_Base_ptr)
           std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::end
                     (in_stack_fffffffffffff548._M_node);
      bVar2 = std::operator!=(local_4a8,&local_4b0);
      if (!bVar2) break;
      std::multiset<char,_std::less<char>,_std::allocator<char>_>::multiset
                ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x120fdb);
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x120fe8);
      if (ppVar4->second == 4) {
        std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x120fff);
        local_4e8 = (_Base_ptr)
                    std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                              (in_stack_fffffffffffff558._M_node,in_stack_fffffffffffff550._M_node);
        std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121036);
        local_4f0 = (_Base_ptr)
                    std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                              (in_stack_fffffffffffff558._M_node,in_stack_fffffffffffff550._M_node);
        std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x12106d);
        local_4f8 = (_Base_ptr)
                    std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                              (in_stack_fffffffffffff558._M_node,in_stack_fffffffffffff550._M_node);
        std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1210a4);
        local_500 = (_Base_ptr)
                    std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                              (in_stack_fffffffffffff558._M_node,in_stack_fffffffffffff550._M_node);
        std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1210db);
        std::multiset<char,_std::less<char>,_std::allocator<char>_>::multiset
                  ((multiset<char,_std::less<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff550._M_node,
                   (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff548._M_node);
        CardStyle::CardStyle
                  ((CardStyle *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580),
                   (Type)((ulong)in_stack_fffffffffffff578._M_node >> 0x20),
                   (int)in_stack_fffffffffffff578._M_node,
                   (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                   (int)((ulong)in_stack_fffffffffffff568 >> 0x20),(int)in_stack_fffffffffffff568);
        std::multiset<char,_std::less<char>,_std::allocator<char>_>::~multiset
                  ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x121135);
        bVar2 = operator<(local_20,&local_540);
        if (bVar2) {
          std::vector<CardStyle,std::allocator<CardStyle>>::emplace_back<CardStyle&>
                    ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                     in_stack_fffffffffffff560._M_node,
                     (CardStyle *)in_stack_fffffffffffff558._M_node);
        }
        if (local_20->type == QUARD) {
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1211ef);
          if (local_20->id < (int)ppVar4->first) {
            std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::map
                      ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                        *)in_stack_fffffffffffff550._M_node,
                       (map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                        *)in_stack_fffffffffffff548._M_node);
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121233);
            pmVar5 = std::
                     map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                     operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                 *)in_stack_fffffffffffff590._M_node,
                                (key_type *)in_stack_fffffffffffff588);
            *pmVar5 = *pmVar5 + -4;
            std::
            vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                      *)0x121271);
            bVar2 = GenCarry((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                              *)in_stack_fffffffffffff728._M_node,
                             (uint)((ulong)in_stack_fffffffffffff720._M_node >> 0x20),
                             (int)in_stack_fffffffffffff720._M_node,
                             (vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffff718._M_node);
            if (bVar2) {
              local_5c0 = local_5b8;
              local_5c8._M_current =
                   (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffff548._M_node);
              local_5d0 = (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                          std::
                          vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffff548._M_node);
              while (bVar2 = __gnu_cxx::operator!=
                                       ((__normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                                         *)in_stack_fffffffffffff550._M_node,
                                        (__normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                                         *)in_stack_fffffffffffff548._M_node), bVar2) {
                local_5d8 = __gnu_cxx::
                            __normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                            ::operator*(&local_5c8);
                std::multiset<char,_std::less<char>,_std::allocator<char>_>::multiset
                          ((multiset<char,_std::less<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff550._M_node,
                           (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff548._M_node);
                local_610 = local_5d8;
                local_618._M_node =
                     (_Base_ptr)
                     std::multiset<char,_std::less<char>,_std::allocator<char>_>::begin
                               (in_stack_fffffffffffff548._M_node);
                local_620._M_node =
                     (_Base_ptr)
                     std::multiset<char,_std::less<char>,_std::allocator<char>_>::end
                               (in_stack_fffffffffffff548._M_node);
                while (bVar2 = std::operator!=(&local_618,&local_620), bVar2) {
                  pcVar6 = std::_Rb_tree_const_iterator<char>::operator*
                                     ((_Rb_tree_const_iterator<char> *)
                                      in_stack_fffffffffffff550._M_node);
                  local_621 = *pcVar6;
                  local_630 = (_Base_ptr)
                              std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                        (in_stack_fffffffffffff558._M_node,
                                         in_stack_fffffffffffff550._M_node);
                  std::_Rb_tree_const_iterator<char>::operator++
                            ((_Rb_tree_const_iterator<char> *)in_stack_fffffffffffff550._M_node);
                }
                local_634 = 4;
                std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                          ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x12144f);
                local_638 = 2;
                std::vector<CardStyle,std::allocator<CardStyle>>::
                emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int,int_const&>
                          ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                           CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580),
                           &(in_stack_fffffffffffff578._M_node)->_M_color,
                           (char *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                           in_stack_fffffffffffff568,(int *)in_stack_fffffffffffff560._M_node,
                           (int *)in_stack_fffffffffffff558._M_node);
                std::multiset<char,_std::less<char>,_std::allocator<char>_>::~multiset
                          ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x12149d);
                __gnu_cxx::
                __normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_5c8);
              }
            }
            std::
            vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff560._M_node);
            std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::~map
                      ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                        *)0x1214cb);
            goto LAB_001214e9;
          }
          local_364 = 0x24;
        }
        else {
LAB_001214e9:
          std::multiset<char,_std::less<char>,_std::allocator<char>_>::clear
                    ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x1214f6);
          local_364 = 0;
        }
        CardStyle::~CardStyle((CardStyle *)0x12150e);
        if (local_364 == 0) goto LAB_00121533;
      }
      else {
LAB_00121533:
        if (local_20->type == MONO) {
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121551);
          if ((int)ppVar4->first <= local_20->id) {
            local_364 = 0x24;
            goto LAB_001222f6;
          }
          std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                    ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x12157e);
          local_640 = (_Base_ptr)
                      std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                (in_stack_fffffffffffff558._M_node,in_stack_fffffffffffff550._M_node
                                );
          if (local_20->len == 1) {
            local_644 = 1;
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1215ce);
            std::vector<CardStyle,std::allocator<CardStyle>>::
            emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                      ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                       CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                       (Type *)in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560._M_node,
                       (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff558._M_node);
          }
          else {
            local_648 = 1;
            ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                               ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x12160d);
            local_64c = (int)ppVar4->first;
            local_658 = local_4a8[0]._M_node;
            do {
              local_668 = local_658;
              local_660._M_node =
                   (_Base_ptr)
                   std::next<std::_Rb_tree_iterator<std::pair<char_const,int>>>
                             (in_stack_fffffffffffff548,0x121649);
              local_670._M_node =
                   (_Base_ptr)
                   std::
                   map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                   end(in_stack_fffffffffffff548._M_node);
              bVar2 = std::operator!=(&local_660,&local_670);
              if (!bVar2) goto LAB_001222eb;
              std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator++
                        ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)
                         in_stack_fffffffffffff550._M_node);
              ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                                 ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1216ab);
              local_64c = local_64c + 1;
              if (ppVar4->first != local_64c) goto LAB_001222eb;
              std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1216d5);
              local_678 = (_Base_ptr)
                          std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                    (in_stack_fffffffffffff558._M_node,
                                     in_stack_fffffffffffff550._M_node);
              local_648 = local_648 + 1;
            } while ((local_648 < 5) || (local_648 != local_20->len));
            local_67c = 1;
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121741);
            std::vector<CardStyle,std::allocator<CardStyle>>::
            emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                      ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                       CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                       (Type *)in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560._M_node,
                       (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff558._M_node,(int *)in_stack_fffffffffffff550._M_node);
          }
        }
        else if (local_20->type == PAIR) {
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121799);
          if (((int)ppVar4->first <= local_20->id) ||
             (ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                                 ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1217b6),
             ppVar4->second < 2)) {
            local_364 = 0x24;
            goto LAB_001222f6;
          }
          std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                    ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1217d9);
          local_688 = (_Base_ptr)
                      std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                (in_stack_fffffffffffff558._M_node,in_stack_fffffffffffff550._M_node
                                );
          std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                    ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121810);
          local_690 = (_Base_ptr)
                      std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                (in_stack_fffffffffffff558._M_node,in_stack_fffffffffffff550._M_node
                                );
          if (local_20->len == 1) {
            local_694 = 2;
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121860);
            std::vector<CardStyle,std::allocator<CardStyle>>::
            emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                      ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                       CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                       (Type *)in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560._M_node,
                       (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff558._M_node);
          }
          else {
            local_698 = 1;
            ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                               ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x12189f);
            local_69c = (int)ppVar4->first;
            local_6a8 = local_4a8[0]._M_node;
            do {
              local_6b8 = local_6a8;
              local_6b0._M_node =
                   (_Base_ptr)
                   std::next<std::_Rb_tree_iterator<std::pair<char_const,int>>>
                             (in_stack_fffffffffffff548,0x1218db);
              local_6c0._M_node =
                   (_Base_ptr)
                   std::
                   map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                   end(in_stack_fffffffffffff548._M_node);
              bVar2 = std::operator!=(&local_6b0,&local_6c0);
              if (!bVar2) goto LAB_001222eb;
              std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator++
                        ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)
                         in_stack_fffffffffffff550._M_node);
              ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                                 ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x12193d);
              local_69c = local_69c + 1;
              if ((ppVar4->first != local_69c) ||
                 (ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                                     ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121962),
                 ppVar4->second < 2)) goto LAB_001222eb;
              std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x12197a);
              local_6c8 = (_Base_ptr)
                          std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                    (in_stack_fffffffffffff558._M_node,
                                     in_stack_fffffffffffff550._M_node);
              std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1219b1);
              local_6d0 = (_Base_ptr)
                          std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                    (in_stack_fffffffffffff558._M_node,
                                     in_stack_fffffffffffff550._M_node);
              local_698 = local_698 + 1;
            } while ((local_698 < 3) || (local_698 != local_20->len));
            local_6d4 = 2;
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121a1d);
            std::vector<CardStyle,std::allocator<CardStyle>>::
            emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                      ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                       CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                       (Type *)in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560._M_node,
                       (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff558._M_node,(int *)in_stack_fffffffffffff550._M_node);
          }
        }
        else if (local_20->type == TRIPLE) {
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121a75);
          if (((int)ppVar4->first <= local_20->id) ||
             (ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                                 ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121a92),
             ppVar4->second < 3)) {
            local_364 = 0x24;
            goto LAB_001222f6;
          }
          std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                    ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121ab5);
          local_6e0 = (_Base_ptr)
                      std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                (in_stack_fffffffffffff558._M_node,in_stack_fffffffffffff550._M_node
                                );
          std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                    ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121aec);
          local_6e8 = (_Base_ptr)
                      std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                (in_stack_fffffffffffff558._M_node,in_stack_fffffffffffff550._M_node
                                );
          std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                    ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121b23);
          local_6f0 = (_Base_ptr)
                      std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                (in_stack_fffffffffffff558._M_node,in_stack_fffffffffffff550._M_node
                                );
          if (local_20->carry == 0) {
            if (local_20->len == 1) {
              local_6f4 = 3;
              std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121b85);
              std::vector<CardStyle,std::allocator<CardStyle>>::
              emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                        ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                         CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                         (Type *)in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560._M_node
                         ,(multiset<char,_std::less<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff558._M_node);
            }
            else {
              local_6f8 = 1;
              ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                                 ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121bc4);
              local_6fc = (int)ppVar4->first;
              local_708 = local_4a8[0]._M_node;
              do {
                local_718 = local_708;
                local_710._M_node =
                     (_Base_ptr)
                     std::next<std::_Rb_tree_iterator<std::pair<char_const,int>>>
                               (in_stack_fffffffffffff548,0x121c00);
                local_720._M_node =
                     (_Base_ptr)
                     std::
                     map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                     end(in_stack_fffffffffffff548._M_node);
                bVar2 = std::operator!=(&local_710,&local_720);
                if (!bVar2) goto LAB_001222eb;
                std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator++
                          ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)
                           in_stack_fffffffffffff550._M_node);
                ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                                   ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121c62);
                local_6fc = local_6fc + 1;
                if ((ppVar4->first != local_6fc) ||
                   (ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                                       ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121c87),
                   ppVar4->second < 3)) goto LAB_001222eb;
                std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                          ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121c9f);
                local_728 = (_Base_ptr)
                            std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                      (in_stack_fffffffffffff558._M_node,
                                       in_stack_fffffffffffff550._M_node);
                std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                          ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121cd0);
                local_730 = (_Base_ptr)
                            std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                      (in_stack_fffffffffffff558._M_node,
                                       in_stack_fffffffffffff550._M_node);
                std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                          ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121d01);
                local_738 = (_Base_ptr)
                            std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                      (in_stack_fffffffffffff558._M_node,
                                       in_stack_fffffffffffff550._M_node);
                local_6f8 = local_6f8 + 1;
              } while (local_6f8 != local_20->len);
              local_73c = 3;
              std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121d62);
              std::vector<CardStyle,std::allocator<CardStyle>>::
              emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                        ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                         CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                         (Type *)in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560._M_node
                         ,(multiset<char,_std::less<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff558._M_node,(int *)in_stack_fffffffffffff550._M_node
                        );
            }
          }
          else {
            std::multiset<char,_std::less<char>,_std::allocator<char>_>::clear
                      ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x121dac);
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121db9);
            local_748 = (_Base_ptr)
                        std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                  (in_stack_fffffffffffff558._M_node,
                                   in_stack_fffffffffffff550._M_node);
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121de7);
            local_750 = (_Base_ptr)
                        std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                  (in_stack_fffffffffffff558._M_node,
                                   in_stack_fffffffffffff550._M_node);
            std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121e18);
            in_stack_fffffffffffff590 =
                 std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                           (in_stack_fffffffffffff558._M_node,in_stack_fffffffffffff550._M_node);
            local_75c = 1;
            local_758 = in_stack_fffffffffffff590._M_node;
            ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                               ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121e54);
            local_760 = (int)ppVar4->first;
            std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::map
                      ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                        *)in_stack_fffffffffffff550._M_node,
                       (map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                        *)in_stack_fffffffffffff548._M_node);
            local_798[0]._M_node = local_4a8[0]._M_node;
            do {
              local_7a0._M_node =
                   (_Base_ptr)
                   std::
                   map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                   end(in_stack_fffffffffffff548._M_node);
              bVar2 = std::operator!=(local_798,&local_7a0);
              if (!bVar2) break;
              std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x121ec5);
              in_stack_fffffffffffff588 =
                   std::
                   map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                   operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                               *)in_stack_fffffffffffff590._M_node,
                              (key_type *)in_stack_fffffffffffff588);
              *in_stack_fffffffffffff588 = 0;
              std::
              vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                        *)0x121ef4);
              if ((local_75c == local_20->len) &&
                 (in_stack_fffffffffffff587 =
                       GenCarry((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                 *)in_stack_fffffffffffff728._M_node,
                                (uint)((ulong)in_stack_fffffffffffff720._M_node >> 0x20),
                                (int)in_stack_fffffffffffff720._M_node,
                                (vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffff718._M_node),
                 (bool)in_stack_fffffffffffff587)) {
                local_7c0 = local_7b8;
                local_7c8._M_current =
                     (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffff548._M_node);
                local_7d0 = (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                            std::
                            vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                            ::end((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_fffffffffffff548._M_node);
                while (bVar2 = __gnu_cxx::operator!=
                                         ((__normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                                           *)in_stack_fffffffffffff550._M_node,
                                          (__normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                                           *)in_stack_fffffffffffff548._M_node), bVar2) {
                  local_7d8 = __gnu_cxx::
                              __normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                              ::operator*(&local_7c8);
                  std::multiset<char,_std::less<char>,_std::allocator<char>_>::multiset
                            ((multiset<char,_std::less<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff550._M_node,
                             (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff548._M_node);
                  local_810 = local_7d8;
                  local_818._M_node =
                       (_Base_ptr)
                       std::multiset<char,_std::less<char>,_std::allocator<char>_>::begin
                                 (in_stack_fffffffffffff548._M_node);
                  local_820._M_node =
                       (_Base_ptr)
                       std::multiset<char,_std::less<char>,_std::allocator<char>_>::end
                                 (in_stack_fffffffffffff548._M_node);
                  while (bVar2 = std::operator!=(&local_818,&local_820), bVar2) {
                    pcVar6 = std::_Rb_tree_const_iterator<char>::operator*
                                       ((_Rb_tree_const_iterator<char> *)
                                        in_stack_fffffffffffff550._M_node);
                    local_821 = *pcVar6;
                    in_stack_fffffffffffff578 =
                         std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                   (in_stack_fffffffffffff558._M_node,
                                    in_stack_fffffffffffff550._M_node);
                    local_830 = in_stack_fffffffffffff578._M_node;
                    std::_Rb_tree_const_iterator<char>::operator++
                              ((_Rb_tree_const_iterator<char> *)in_stack_fffffffffffff550._M_node);
                  }
                  local_834 = 3;
                  std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                            ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1220e0);
                  std::vector<CardStyle,std::allocator<CardStyle>>::
                  emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&,int_const&>
                            ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                             CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580),
                             &(in_stack_fffffffffffff578._M_node)->_M_color,
                             (char *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                             in_stack_fffffffffffff568,(int *)in_stack_fffffffffffff560._M_node,
                             (int *)in_stack_fffffffffffff558._M_node);
                  std::multiset<char,_std::less<char>,_std::allocator<char>_>::~multiset
                            ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x122123);
                  __gnu_cxx::
                  __normal_iterator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_*,_std::vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_7c8);
                }
                local_364 = 0x2f;
              }
              else {
                in_stack_fffffffffffff568 =
                     (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                     std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator++
                               ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)
                                in_stack_fffffffffffff550._M_node);
                local_840._M_node =
                     (_Base_ptr)
                     std::
                     map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                     end(in_stack_fffffffffffff548._M_node);
                bVar2 = std::operator==((_Self *)in_stack_fffffffffffff568,&local_840);
                in_stack_fffffffffffff577 = true;
                if (!bVar2) {
                  ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                                     ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x122198);
                  local_760 = local_760 + 1;
                  in_stack_fffffffffffff577 = true;
                  if (ppVar4->first == local_760) {
                    ppVar4 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                                       ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1221c3);
                    in_stack_fffffffffffff577 = ppVar4->second < 3;
                  }
                }
                if ((bool)in_stack_fffffffffffff577 == false) {
                  std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                            ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x1221f5);
                  in_stack_fffffffffffff560 =
                       std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                 (in_stack_fffffffffffff558._M_node,
                                  in_stack_fffffffffffff550._M_node);
                  std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                            ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x122226);
                  in_stack_fffffffffffff558 =
                       std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                 (in_stack_fffffffffffff558._M_node,
                                  in_stack_fffffffffffff550._M_node);
                  std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator->
                            ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)0x122257);
                  in_stack_fffffffffffff550 =
                       std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                                 (in_stack_fffffffffffff558._M_node,
                                  in_stack_fffffffffffff550._M_node);
                  local_75c = local_75c + 1;
                  local_364 = 0;
                }
                else {
                  local_364 = 0x2f;
                }
              }
              std::
              vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff560._M_node);
            } while (local_364 == 0);
            std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::~map
                      ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                        *)0x1222d4);
          }
        }
LAB_001222eb:
        local_364 = 0;
      }
LAB_001222f6:
      std::multiset<char,_std::less<char>,_std::allocator<char>_>::~multiset
                ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x122303);
      std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_char,_int>_> *)in_stack_fffffffffffff550._M_node
                );
    }
    std::vector<CardStyle,_std::allocator<CardStyle>_>::emplace_back<>
              ((vector<CardStyle,_std::allocator<CardStyle>_> *)in_stack_fffffffffffff550._M_node);
  }
  local_21 = 1;
  local_364 = 1;
  std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::~map
            ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *)
             0x122366);
  if ((local_21 & 1) == 0) {
    std::vector<CardStyle,_std::allocator<CardStyle>_>::~vector
              ((vector<CardStyle,_std::allocator<CardStyle>_> *)in_stack_fffffffffffff560._M_node);
  }
  return in_RDI;
}

Assistant:

vector<CardStyle> BattleWithLandlord::GenStrategy(const multiset<byte> &style, const CardStyle &last) const {
    vector <CardStyle> all;
    map<byte, int> count;
    for (auto c = style.begin(); c != style.end(); ++c) {
        if (count.find(*c) != count.end()) {
            ++count[*c];
        } else {
            count[*c] = 1;
        }
    }
    auto vice_joker = count.find(17);
    auto joker = count.find(18);
    if (vice_joker != count.end() && joker != count.end()){
        multiset<byte> ms;
        ms.insert(17);
        ms.insert(18);
        all.emplace_back(CardStyle::JOKER_BOMB, 19, ms);
    }
    if (last.type == CardStyle::PASS) {
        for (auto c = count.begin(); c != count.end(); ++c) {
            for (int k = 1; k <= c->second && k <= 4; ++k) {
                multiset<byte> ms;
                for (int i = 0; i < k; ++i) {
                    ms.insert(c->first);
                }
                if (k == 1) {
                    if (c->first > 0)
                        all.emplace_back(CardStyle::MONO, c->first, ms);
                    else
                        all.emplace_back(CardStyle::EXT, c->first, ms);
                    int len = 1;
                    int prev = c->first;
                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev) break;
                        ms.insert(it->first);
                        if (++len > 4) {
                            all.emplace_back(CardStyle::MONO, c->first, ms, len);
                        }
                    }
                } else if (k == 2) {
                    all.emplace_back(CardStyle::PAIR, c->first, ms);
                    int len = 1;
                    int prev = c->first;
                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev || it->second < 2) break;
                        ms.insert(it->first);
                        ms.insert(it->first);
                        if (++len > 2) {
                            all.emplace_back(CardStyle::PAIR, c->first, ms, len);
                        }
                    }
                } else if (k == 3) {
                    all.emplace_back(CardStyle::TRIPLE, c->first, ms);
                    int len = 1;
                    int prev = c->first;

                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev || it->second < 3) break;
                        ms.insert(it->first);
                        ms.insert(it->first);
                        ms.insert(it->first);
                        ++len;
                        all.emplace_back(CardStyle::TRIPLE, c->first, ms, len);
                    }
                    
                    for (int carry : {1, 2}) {
                        ms.clear();
                        ms.insert(c->first);
                        ms.insert(c->first);
                        ms.insert(c->first);
                        len = 1;
                        prev = c->first;
                        auto count_ = count;
                        for (auto it = c; it != count.end();) {
                            count_[it->first] = 0; // in case of 333 + 3

                            vector<multiset<byte> > comb_res;
                            if (GenCarry(count_, len, carry, comb_res)) {
                                for (auto &cs: comb_res) {
                                    multiset<byte> _union = ms;
                                    for (auto x: cs) {
                                        _union.insert(x);
                                    }
                                    all.emplace_back(CardStyle::TRIPLE, c->first, _union, len, carry);
                                }
                            }
                            if (++it == count.end() || it->first != ++prev || it->second < 3) break;
                            ms.insert(it->first);
                            ms.insert(it->first);
                            ms.insert(it->first);
                            ++len;
                        }
                    }
                } else {
                    all.emplace_back(CardStyle::QUARD_BOMB, c->first, ms);
                    auto count_ = count;
                    count_[c->first] -= 4;
                    for (auto carry: {1, 2}) {
                        vector<multiset<byte> > comb_res;
                        if (GenCarry(count_, 2, carry, comb_res)) {
                            for (auto &cs: comb_res) {
                                multiset<byte> _union = ms;
                                for (auto x: cs) {
                                    _union.insert(x);
                                }
                                all.emplace_back(CardStyle::QUARD, c->first, _union, 2, carry);
                            }
                        }
                    }
                }
            }
        }
        sort(all.begin(), all.end(),
             [](const CardStyle &a, const CardStyle &b) {
             return a.pattern.size() > b.pattern.size();
        });
    } else {
        for (auto c = count.begin(); c != count.end(); ++c) {
            multiset<byte> ms;
            if (c->second == 4) {
                ms.insert(c->first);
                ms.insert(c->first);
                ms.insert(c->first);
                ms.insert(c->first);
                auto style = CardStyle(CardStyle::QUARD_BOMB, c->first, ms);
                if (last < style) {
                    all.emplace_back(style);
                }
                if (last.type == CardStyle::QUARD) {
                    if (c->first <= last.id) continue;
                    auto count_ = count;
                    count_[c->first] -= 4;
                    vector<multiset<byte> > comb_res;
                    if (GenCarry(count_, 2, last.carry, comb_res)) {
                        for (auto &cs: comb_res) {
                            multiset<byte> _union = ms;
                            for (auto x: cs) {
                                _union.insert(x);
                            }
                            all.emplace_back(CardStyle::QUARD, c->first, _union, 2, last.carry);
                        }
                    }
                }
                ms.clear();
            }
            if (last.type == CardStyle::MONO) {
                if (c->first <= last.id) continue;
                ms.insert(c->first);
                if (last.len == 1) {
                    all.emplace_back(CardStyle::MONO, c->first, ms);
                } else {
                    int len = 1;
                    int prev = c->first;
                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev) break;
                        ms.insert(it->first);
                        if (++len > 4) {
                            if (len == last.len) {
                                all.emplace_back(CardStyle::MONO, c->first, ms, len);
                                break;
                            }
                        }
                    }
                }
            } else if (last.type == CardStyle::PAIR) {
                if (c->first <= last.id || c->second < 2) continue;
                ms.insert(c->first);
                ms.insert(c->first);
                if (last.len == 1) {
                    all.emplace_back(CardStyle::PAIR, c->first, ms);
                } else {
                    int len = 1;
                    int prev = c->first;
                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev || it->second < 2) break;
                        ms.insert(it->first);
                        ms.insert(it->first);
                        if (++len > 2) {
                            if (len == last.len) {
                                all.emplace_back(CardStyle::PAIR, c->first, ms, len);
                                break;
                            }
                        }
                    }
                }
            } else if (last.type == CardStyle::TRIPLE) {
                if (c->first <= last.id || c->second < 3) continue;
                ms.insert(c->first);
                ms.insert(c->first);
                ms.insert(c->first);
                if (last.carry == 0) {
                    if (last.len == 1) {
                        all.emplace_back(CardStyle::TRIPLE, c->first, ms);
                    } else {
                        int len = 1;
                        int prev = c->first;
                        for (auto it = c; next(it) != count.end();) {
                            if ((++it)->first != ++prev || it->second < 3) break;
                            ms.insert(it->first);
                            ms.insert(it->first);
                            ms.insert(it->first);
                            ++len;
                            if (len == last.len) {
                                all.emplace_back(CardStyle::TRIPLE, c->first, ms, len);
                                break;
                            }
                        }
                    }
                } else {
                    ms.clear();
                    ms.insert(c->first);
                    ms.insert(c->first);
                    ms.insert(c->first);
                    int len = 1;
                    int prev = c->first;
                    auto count_ = count;
                    for (auto it = c; it != count.end();) {
                        count_[it->first] = 0;

                        vector<multiset<byte> > comb_res;
                        if (len == last.len && GenCarry(count_, len, last.carry, comb_res)) {
                            for (auto &cs: comb_res) {
                                multiset<byte> _union = ms;
                                for (auto x: cs) {
                                    _union.insert(x);
                                }
                                all.emplace_back(CardStyle::TRIPLE, c->first, _union, len, last.carry);
                            }
                            break;
                        }

                        if (++it == count.end() || it->first != ++prev || it->second < 3) break;
                        ms.insert(it->first);
                        ms.insert(it->first);
                        ms.insert(it->first);
                        ++len;
                    }
                }
            }
        }
        all.emplace_back(); // PASS
    }
    return all;
}